

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::TiledInputFile::Data::initialize(Data *this)

{
  exr_storage_t eVar1;
  exr_result_t eVar2;
  undefined8 uVar3;
  ArgExc *this_00;
  char *text;
  exr_const_context_t in_RDI;
  int in_stack_0000019c;
  Context *in_stack_000001a0;
  char *in_stack_ffffffffffffffc8;
  ArgExc *in_stack_ffffffffffffffd0;
  exr_tile_level_mode_t *in_stack_ffffffffffffffd8;
  int part_index;
  exr_const_context_t in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff4;
  exr_const_context_t ctxt;
  
  ctxt = in_RDI;
  eVar1 = Context::storage(in_stack_000001a0,in_stack_0000019c);
  if (eVar1 != EXR_STORAGE_TILED) {
    uVar3 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    __cxa_throw(uVar3,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  Context::operator_cast_to__priv_exr_context_t_((Context *)0x18d3e8);
  eVar2 = exr_get_tile_descriptor
                    (ctxt,in_stack_fffffffffffffff4,(uint32_t *)in_stack_ffffffffffffffe8,
                     (uint32_t *)in_RDI,in_stack_ffffffffffffffd8,
                     (exr_tile_round_mode_t *)in_stack_ffffffffffffffd0);
  part_index = (int)((ulong)in_RDI >> 0x20);
  if (eVar2 != 0) {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(this_00,in_stack_ffffffffffffffc8);
    __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  Context::operator_cast_to__priv_exr_context_t_((Context *)0x18d47f);
  eVar2 = exr_get_tile_levels(in_stack_ffffffffffffffe8,part_index,(int *)in_stack_ffffffffffffffd8,
                              (int *)in_stack_ffffffffffffffd0);
  if (eVar2 != 0) {
    text = (char *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(in_stack_ffffffffffffffd0,text);
    __cxa_throw(text,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  return;
}

Assistant:

void initialize ()
    {
        if (_ctxt->storage (partNumber) != EXR_STORAGE_TILED)
            throw IEX_NAMESPACE::ArgExc ("File part is not a tiled part");

        if (EXR_ERR_SUCCESS != exr_get_tile_descriptor (
                *_ctxt,
                partNumber,
                &tile_x_size,
                &tile_y_size,
                &tile_level_mode,
                &tile_round_mode))
            throw IEX_NAMESPACE::ArgExc ("Unable to query tile descriptor");

        if (EXR_ERR_SUCCESS != exr_get_tile_levels (
                *_ctxt,
                partNumber,
                &num_x_levels,
                &num_y_levels))
            throw IEX_NAMESPACE::ArgExc ("Unable to query number of tile levels");
    }